

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O2

meta_redirect_type_enum ctemplate_htmlparser::meta_redirect_type(char *value)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  meta_redirect_type_enum mVar4;
  meta_redirect_type_enum mVar5;
  char *pcVar6;
  
  mVar4 = META_REDIRECT_TYPE_NONE;
  mVar5 = META_REDIRECT_TYPE_NONE;
  if (value != (char *)0x0) {
    pcVar6 = value + 1;
    while( true ) {
      bVar1 = pcVar6[-1];
      if (((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         (9 < (byte)(bVar1 - 0x30))) break;
      pcVar6 = pcVar6 + 1;
    }
    mVar5 = mVar4;
    if (bVar1 == 0x3b) {
      pcVar6 = ignore_spaces(pcVar6);
      iVar2 = strncasecmp(pcVar6,"url",3);
      if (iVar2 == 0) {
        pcVar6 = ignore_spaces(pcVar6 + 3);
        if (*pcVar6 == '=') {
          pcVar6 = ignore_spaces(pcVar6 + 1);
          cVar3 = *pcVar6;
          if ((cVar3 == '\'') || (cVar3 == '\"')) {
            cVar3 = pcVar6[1];
          }
          mVar5 = META_REDIRECT_TYPE_URL - (cVar3 == '\0');
        }
      }
    }
  }
  return mVar5;
}

Assistant:

enum meta_redirect_type_enum meta_redirect_type(const char *value) {

  if (value == NULL)
    return META_REDIRECT_TYPE_NONE;

  /* Match while [ \t\r\n0-9]* */
  value = ignore_spaces_or_digits(value);

  /* Verify that we got a semi-colon character */
  if (*value != ';')
    return META_REDIRECT_TYPE_NONE;
  value++;

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  /* Validate that we have 'URL' */
  if (strncasecmp(value, "url", strlen("url")) != 0)
    return META_REDIRECT_TYPE_NONE;

  value += strlen("url");

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  if (*value != '=')
    return META_REDIRECT_TYPE_NONE;
  value++;

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  /* The HTML5 spec allows for the url to be quoted, so we skip a single or
   * double quote if we find one.
   */
  if (*value == '"' || *value == '\'')
    value++;

  if (*value == '\0')
    return META_REDIRECT_TYPE_URL_START;
  else
    return META_REDIRECT_TYPE_URL;
}